

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.c
# Opt level: O2

void swap(char *a,char *b,size_t size)

{
  char cVar1;
  size_t i;
  
  for (i = 0; size != i; i = i + 1) {
    cVar1 = a[i];
    a[i] = b[i];
    b[i] = cVar1;
  }
  return;
}

Assistant:

static void
swap (char *a, char *b, size_t size)
{
  size_t i;

  for (i = 0; i < size; i++, a++, b++)
    {
      char t;

      t = *a;
      *a = *b;
      *b = t;
    }
}